

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ffs.c
# Opt level: O3

FFSTypeHandle_conflict FFS_target_from_encode(FFSContext c,char *data)

{
  Conversion_status CVar1;
  FFSTypeHandle_conflict format;
  
  format = FFSTypeHandle_from_encode(c,data);
  if (format != (FFSTypeHandle_conflict)0x0) {
    CVar1 = format->status;
    if (CVar1 == not_checked) {
      FFS_determine_conversion(c,format);
      CVar1 = format->status;
    }
    if (CVar1 == conversion_set) {
      return format->conversion_target;
    }
  }
  return (FFSTypeHandle_conflict)0x0;
}

Assistant:

extern FFSTypeHandle
FFS_target_from_encode(FFSContext c, char *data)
{
    FFSTypeHandle f;
    /* first element in encoded buffer is format ID */
    f = FFSTypeHandle_from_encode(c, data);
    if (f == NULL) return NULL;
    if (f->status == not_checked) {
	FFS_determine_conversion(c, f);
    }
    if (f->status == none_available) return NULL;
    if (f->status == conversion_set) return f->conversion_target;
    assert(0);
    return NULL;
}